

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

dlist_t * dlist_ins_after(dlist_head_t *head,dlist_t *dlist,void *data)

{
  int iVar1;
  dlist_t *tmp;
  void *data_local;
  dlist_t *dlist_local;
  dlist_head_t *head_local;
  
  if (head == (dlist_head_t *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8d,
                  "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
  }
  if (dlist == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8e,
                  "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
  }
  head_local = (dlist_head_t *)dlist_new(data);
  if ((dlist_t *)head_local == (dlist_t *)0x0) {
    head_local = (dlist_head_t *)0x0;
  }
  else {
    iVar1 = dlist_insl_after(head,dlist,(dlist_t *)head_local);
    if (iVar1 == 0) {
      dlist_delete((dlist_t *)head_local,(_func_void_void_ptr *)0x0);
      head_local = (dlist_head_t *)0x0;
    }
  }
  return (dlist_t *)head_local;
}

Assistant:

dlist_t *dlist_ins_after(dlist_head_t *head, dlist_t *dlist, void *data) {
  assert(head != NULL);
  assert(dlist != NULL);
  
  dlist_t *tmp = dlist_new(data);
  
  if (!tmp)
    return NULL;
  
  if (dlist_insl_after(head, dlist, tmp)) {
    return tmp;
  } else {
    dlist_delete(tmp, NULL);
    return NULL;
  }
}